

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O0

void test_open_address_hashmap_simple_insert(planck_unit_test_t *tc)

{
  char cVar1;
  char *state;
  planck_unit_result_t pVar2;
  ion_err_t iVar3;
  int iVar4;
  ion_status_t iVar5;
  _func_int_ion_hashmap_t_ptr_ion_key_t_int *p_Var6;
  char local_92 [8];
  ion_byte_t str_1 [10];
  ion_value_t value;
  ion_key_t key;
  char cStack_70;
  int iStack_6c;
  ion_record_status_t status_1;
  ion_status_t status;
  ion_byte_t str [10];
  int bucket_size;
  ion_record_info_t record;
  int offset;
  int i;
  ion_hashmap_t map;
  planck_unit_test_t *tc_local;
  
  map.entry = &tc->result;
  initialize_hash_map_std_conditions((ion_hashmap_t *)&offset);
  str._6_4_ = i;
  bucket_size = i._4_4_;
  iVar4 = str._6_4_ + 1 + bucket_size;
  record.key_size = 0;
  do {
    state = map.entry;
    if ((int)map.super.id <= record.key_size) {
      iVar3 = oah_destroy((ion_hashmap_t *)&offset);
      pVar2 = planck_unit_assert_true
                        ((planck_unit_test_t *)state,(uint)(iVar3 == '\0'),0x12f,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar2 != '\0') {
        return;
      }
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    for (record.value_size = 0; record.value_size < (int)map.super.id;
        record.value_size = record.value_size + 1) {
      sprintf(&status.field_0x2,"%02i is key",(ulong)(uint)record.value_size);
      iVar5 = oah_insert((ion_hashmap_t *)&offset,&record.value_size,&status.field_0x2);
      if ((record.key_size == 0) ||
         ((undefined1)map.super.type == dictionary_type_open_address_file_hash_t)) {
        cStack_70 = iVar5.error;
        pVar2 = planck_unit_assert_true
                          ((planck_unit_test_t *)map.entry,(uint)(cStack_70 == '\0'),0x119,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar2 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        iStack_6c = iVar5.count;
        pVar2 = planck_unit_assert_true
                          ((planck_unit_test_t *)map.entry,(uint)(iStack_6c == 1),0x11a,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar2 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
      }
    }
    for (record.value_size = 0; record.value_size < (int)map.super.id;
        record.value_size = record.value_size + 1) {
      cVar1 = (char)map.compute_hash
                    [(((record.value_size + record.key_size) % (int)map.super.id) * iVar4) %
                     (int)(map.super.id * iVar4)];
      p_Var6 = map.compute_hash +
               (long)((((record.value_size + record.key_size) % (int)map.super.id) * iVar4) %
                     (int)(map.super.id * iVar4)) + 1;
      str_1._2_8_ = map.compute_hash +
                    (long)(int)str._6_4_ +
                    (long)((((record.value_size + record.key_size) % (int)map.super.id) * iVar4) %
                          (int)(map.super.id * iVar4)) + 1;
      sprintf(local_92,"%02i is key",
              (long)(record.value_size + record.key_size) % (long)(int)map.super.id & 0xffffffff);
      pVar2 = planck_unit_assert_true
                        ((planck_unit_test_t *)map.entry,(uint)(cVar1 == -3),0x127,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar2 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      pVar2 = planck_unit_assert_true
                        ((planck_unit_test_t *)map.entry,
                         (uint)(*(int *)p_Var6 ==
                               (record.value_size + record.key_size) % (int)map.super.id),0x129,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar2 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      pVar2 = planck_unit_assert_str_are_equal
                        ((planck_unit_test_t *)map.entry,local_92,(char *)str_1._2_8_,299,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                        );
      if (pVar2 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
    }
    record.key_size = record.key_size + 1;
  } while( true );
}

Assistant:

void
test_open_address_hashmap_simple_insert(
	planck_unit_test_t *tc
) {
	/* create handler for hashmap */
	ion_hashmap_t	map;
	int				i;
	int				offset;

	initialize_hash_map_std_conditions(&map);

	/*Manually populate records */
	ion_record_info_t record = map.super.record;

	/* manually populate array */
#if ION_DEBUG

	char *pos_ptr = map.entry;

#endif

	int bucket_size = sizeof(char) + record.key_size + record.value_size;

	for (offset = 0; offset < map.map_size; offset++) {
		/* apply continual offsets */
#if ION_DEBUG
		printf("entry loc: %p %p \n", map.entry, pos_ptr);
		pos_ptr = (map.entry + (offset * bucket_size) % (map.map_size * bucket_size));
#endif

		for (i = 0; i < map.map_size; i++) {
			/* build up the value */
			ion_byte_t str[10];

			sprintf((char *) str, "%02i is key", i);

			ion_status_t status = oah_insert(&map, (&i), str);	/* this is will wrap */

			if ((offset == 0) || (wc_duplicate == map.write_concern)) {
				PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
				PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
			}
		}

		for (i = 0; i < map.map_size; i++) {
			ion_record_status_t status	= ((ion_hash_bucket_t *) (map.entry + ((((i + offset) % map.map_size) * bucket_size) % (map.map_size * bucket_size))))->status;
			ion_key_t			key		= (((ion_hash_bucket_t *) (map.entry + ((((i + offset) % map.map_size) * bucket_size) % (map.map_size * bucket_size))))->data);
			ion_value_t			value	= (((ion_hash_bucket_t *) (map.entry + ((((i + offset) % map.map_size) * bucket_size) % (map.map_size * bucket_size))))->data + record.key_size);

			/* build up expected value */
			ion_byte_t str[10];

			sprintf((char *) str, "%02i is key", (i + offset) % map.map_size);
			PLANCK_UNIT_ASSERT_TRUE(tc, status == ION_IN_USE);
			/* check to ensure key is pointing at correct location */
			PLANCK_UNIT_ASSERT_TRUE(tc, *(int *) key == (i + offset) % map.map_size);
			/* While str and value are unsigned, equality test is signed, so casting required */
			PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) str, (char *) value);
		}
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}